

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDiv.cpp
# Opt level: O1

void TPZShapeHDiv<pzshape::TPZShapeTetra>::ComputeVecandShape(TPZShapeData *data)

{
  int iVar1;
  pair<int,_long> *ppVar2;
  int iVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  int iVar8;
  int iVar9;
  MElementType MVar10;
  int *piVar11;
  ostream *this;
  long *plVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  int iVar19;
  long lVar20;
  bool bVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int maxorder [3];
  int scalarorder;
  TPZGenMatrix<int> shapeorders;
  TPZManVector<long,_27> FirstIndex;
  TPZManVector<int,_45> VectorSides;
  TPZManVector<int,_45> bilinear;
  TPZManVector<int,_45> normalsides;
  TPZManVector<int,_45> directions;
  TPZManVector<int,_10> facevector;
  TPZManVector<int,_81> vecpermute;
  int local_6d4 [3];
  TPZVec<int> *local_6c8;
  ulong local_6c0;
  long local_6b8;
  long local_6b0;
  int local_6a8;
  int local_6a4;
  undefined **local_6a0;
  undefined **local_698;
  long local_690;
  ulong local_688;
  TPZManVector<int,_10> local_680;
  TPZManVector<int,_27> local_638;
  TPZVec<int> local_540;
  int local_520 [46];
  TPZVec<int> local_468;
  int local_448 [46];
  TPZVec<int> local_390;
  int local_370 [46];
  TPZVec<int> local_2b8;
  int local_298 [46];
  TPZManVector<int,_10> local_1e0;
  TPZVec<int> local_198;
  int local_178 [82];
  
  TPZVec<int>::TPZVec(&local_540,0);
  local_540._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018e5110;
  local_540.fStore = local_520;
  local_540.fNElements = 0x2d;
  local_540.fNAlloc = 0;
  TPZVec<int>::TPZVec(&local_468,0);
  local_468.fStore = local_448;
  local_468._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018e5110;
  local_468.fNElements = 0x2d;
  local_468.fNAlloc = 0;
  TPZVec<int>::TPZVec(&local_2b8,0);
  local_2b8.fStore = local_298;
  local_2b8._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018e5110;
  local_2b8.fNElements = 0x2d;
  local_2b8.fNAlloc = 0;
  TPZVec<int>::TPZVec(&local_390,0);
  local_390.fStore = local_370;
  local_390._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018e5110;
  local_390.fNElements = 0x2d;
  local_390.fNAlloc = 0;
  pztopology::TPZTetrahedron::GetSideHDivDirections(&local_540,&local_2b8,&local_468,&local_390);
  if ((data->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fNElements == 0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHDiv.cpp"
               ,0x6c);
  }
  local_6a8 = (data->fHDivConnectOrders).super_TPZVec<int>.fStore[4];
  iVar8 = pzshape::TPZShapeTetra::NShapeF(&(data->fH1ConnectOrders).super_TPZVec<int>);
  local_198._vptr_TPZVec = (_func_int **)CONCAT44(local_198._vptr_TPZVec._4_4_,0xe);
  TPZManVector<int,_10>::TPZManVector(&local_1e0,local_540.fNElements,(int *)&local_198);
  uVar18 = 0;
  local_6c8 = &(data->fH1ConnectOrders).super_TPZVec<int>;
  TPZVec<int>::TPZVec(&local_198,0);
  local_198.fStore = local_178;
  local_698 = &PTR__TPZManVector_018e4fb0;
  local_198._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018e4fb0;
  local_198.fNElements = 0x2d;
  local_198.fNAlloc = 0;
  iVar19 = 0;
  do {
    iVar9 = pztopology::TPZTetrahedron::SideDimension(iVar19);
    if (iVar9 == 2) {
      TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_680);
      pztopology::TPZTetrahedron::LowerDimensionSides(iVar19,(TPZStack<int,_10> *)&local_680);
      uVar7 = (uint)local_680.super_TPZVec<int>.fNElements;
      uVar16 = (uint)local_680.super_TPZVec<int>.fNElements + 1;
      TPZManVector<int,_27>::TPZManVector(&local_638,(long)(int)uVar16);
      HDivPermutation(iVar19,data,&local_638.super_TPZVec<int>);
      if (uVar7 < 0x7fffffff) {
        uVar17 = 0;
        do {
          local_198.fStore[(long)(int)uVar18 + uVar17] =
               local_638.super_TPZVec<int>.fStore[uVar17] + uVar18;
          local_1e0.super_TPZVec<int>.fStore[(long)(int)uVar18 + uVar17] = iVar19;
          uVar17 = uVar17 + 1;
        } while (uVar16 != uVar17);
        uVar18 = uVar18 + (int)uVar17;
      }
      if (local_638.super_TPZVec<int>.fStore == local_638.fExtAlloc) {
        local_638.super_TPZVec<int>.fStore = (int *)0x0;
      }
      local_638.super_TPZVec<int>.fNAlloc = 0;
      local_638.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
      if (local_638.super_TPZVec<int>.fStore != (int *)0x0) {
        operator_delete__(local_638.super_TPZVec<int>.fStore);
      }
      TPZManVector<int,_10>::~TPZManVector(&local_680);
    }
    auVar6 = _DAT_014f8350;
    auVar5 = _DAT_014f8340;
    iVar19 = iVar19 + 1;
  } while (iVar19 != 0xf);
  lVar20 = (long)(int)uVar18;
  lVar14 = local_198.fNElements - lVar20;
  if (lVar14 != 0 && lVar20 <= local_198.fNElements) {
    lVar15 = lVar14 + -1;
    auVar23._8_4_ = (int)lVar15;
    auVar23._0_8_ = lVar15;
    auVar23._12_4_ = (int)((ulong)lVar15 >> 0x20);
    uVar17 = 0;
    auVar23 = auVar23 ^ _DAT_014f8350;
    uVar16 = uVar18;
    do {
      auVar24._8_4_ = (int)uVar17;
      auVar24._0_8_ = uVar17;
      auVar24._12_4_ = (int)(uVar17 >> 0x20);
      auVar24 = (auVar24 | auVar5) ^ auVar6;
      if ((bool)(~(auVar24._4_4_ == auVar23._4_4_ && auVar23._0_4_ < auVar24._0_4_ ||
                  auVar23._4_4_ < auVar24._4_4_) & 1)) {
        local_198.fStore[lVar20 + uVar17] = uVar16;
      }
      if ((auVar24._12_4_ != auVar23._12_4_ || auVar24._8_4_ <= auVar23._8_4_) &&
          auVar24._12_4_ <= auVar23._12_4_) {
        local_198.fStore[lVar20 + uVar17 + 1] = uVar16 + 1;
      }
      uVar17 = uVar17 + 2;
      uVar16 = uVar16 + 2;
    } while ((lVar14 + 1U & 0xfffffffffffffffe) != uVar17);
  }
  TPZGenMatrix<int>::TPZGenMatrix((TPZGenMatrix<int> *)&local_680,(long)iVar8,3);
  pzshape::TPZShapeTetra::ShapeOrder
            (&(data->fCornerNodeIds).super_TPZVec<long>,local_6c8,(TPZGenMatrix<int> *)&local_680);
  local_6a4 = (data->fHDivConnectOrders).super_TPZVec<int>.fStore[4] + 1;
  TPZVec<long>::TPZVec((TPZVec<long> *)&local_638,0);
  local_6a0 = &PTR__TPZManVector_018e5008;
  local_638.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018e5008;
  local_638.super_TPZVec<int>.fStore = local_638.fExtAlloc;
  local_638.super_TPZVec<int>.fNElements = 0x10;
  local_638.super_TPZVec<int>.fNAlloc = 0;
  FirstShapeIndex((TPZVec<long> *)&local_638,&local_6a4);
  local_690 = local_540.fNElements;
  if ((int)uVar18 < 1) {
    iVar8 = 0;
  }
  else {
    local_688 = (ulong)uVar18;
    uVar17 = 0;
    iVar8 = 0;
    local_6b0 = lVar20;
    do {
      local_6b8 = (long)local_198.fStore[uVar17];
      local_6c8 = (TPZVec<int> *)(long)local_540.fStore[local_6b8];
      iVar19 = local_638.super_TPZVec<int>.fStore[(long)((long)&local_6c8->_vptr_TPZVec + 1) * 2];
      local_6c0 = uVar17;
      if ((int)*(undefined8 *)(local_638.super_TPZVec<int>.fStore + (long)local_6c8 * 2) < iVar19) {
        iVar9 = (data->fHDivConnectOrders).super_TPZVec<int>.fStore
                [(long)local_1e0.super_TPZVec<int>.fStore[uVar17] + -10];
        lVar14 = (long)(int)*(undefined8 *)
                             (local_638.super_TPZVec<int>.fStore + (long)local_6c8 * 2);
        do {
          uVar16 = pztopology::TPZTetrahedron::SideDimension((int)local_6c8);
          if ((int)uVar16 < 1) {
LAB_01012642:
            ppVar2 = (data->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fStore;
            ppVar2[iVar8].first = (int)local_6b8;
            ppVar2[iVar8].second = lVar14;
            iVar8 = iVar8 + 1;
          }
          else {
            bVar4 = true;
            uVar17 = 0;
            do {
              piVar11 = TPZGenMatrix<int>::operator()((TPZGenMatrix<int> *)&local_680,lVar14,uVar17)
              ;
              if (iVar9 < *piVar11) {
                bVar4 = false;
              }
              uVar17 = uVar17 + 1;
            } while (uVar16 != uVar17);
            lVar20 = local_6b0;
            if (bVar4) goto LAB_01012642;
          }
          lVar14 = lVar14 + 1;
        } while ((int)lVar14 != iVar19);
      }
      uVar17 = local_6c0 + 1;
    } while (uVar17 != local_688);
  }
  if ((int)uVar18 < local_690) {
    do {
      local_6b8 = (long)local_198.fStore[lVar20];
      iVar19 = local_540.fStore[local_6b8];
      local_6c8 = (TPZVec<int> *)CONCAT44(local_6c8._4_4_,local_468.fStore[local_6b8]);
      local_6c0 = (ulong)local_2b8.fStore[local_6b8];
      MVar10 = pztopology::TPZTetrahedron::Type(iVar19);
      iVar9 = local_638.super_TPZVec<int>.fStore[((long)iVar19 + 1) * 2];
      if ((int)*(undefined8 *)(local_638.super_TPZVec<int>.fStore + (long)iVar19 * 2) < iVar9) {
        lVar14 = (long)(int)*(undefined8 *)(local_638.super_TPZVec<int>.fStore + (long)iVar19 * 2);
        local_6b0 = lVar20;
        do {
          uVar18 = pztopology::TPZTetrahedron::SideDimension(iVar19);
          local_6d4[0] = local_6a8;
          local_6d4[1] = local_6a8;
          local_6d4[2] = local_6a8;
          if ((int)local_6c8 != 0) {
            local_6d4[local_6c0] = local_6d4[local_6c0] + 1;
          }
          if ((int)uVar18 < 1) {
LAB_0101282f:
            ppVar2 = (data->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fStore;
            ppVar2[iVar8].first = (int)local_6b8;
            ppVar2[iVar8].second = lVar14;
            iVar8 = iVar8 + 1;
          }
          else {
            bVar4 = true;
            uVar17 = 0;
            do {
              switch(MVar10) {
              case EOned:
                piVar11 = TPZGenMatrix<int>::operator()((TPZGenMatrix<int> *)&local_680,lVar14,0);
                break;
              case ETriangle:
              case ETetraedro:
                piVar11 = TPZGenMatrix<int>::operator()
                                    ((TPZGenMatrix<int> *)&local_680,lVar14,uVar17);
                iVar13 = local_6d4[uVar17] + 1;
                iVar1 = *piVar11;
                bVar22 = SBORROW4(iVar1,iVar13);
                iVar3 = iVar1 - iVar13;
                bVar21 = iVar1 == iVar13;
                goto LAB_0101280c;
              case EQuadrilateral:
                piVar11 = TPZGenMatrix<int>::operator()
                                    ((TPZGenMatrix<int> *)&local_680,lVar14,uVar17);
                break;
              case EPiramide:
                piVar11 = TPZGenMatrix<int>::operator()
                                    ((TPZGenMatrix<int> *)&local_680,lVar14,uVar17);
                break;
              case EPrisma:
                piVar11 = TPZGenMatrix<int>::operator()
                                    ((TPZGenMatrix<int> *)&local_680,lVar14,uVar17);
                break;
              case ECube:
                piVar11 = TPZGenMatrix<int>::operator()
                                    ((TPZGenMatrix<int> *)&local_680,lVar14,uVar17);
                break;
              default:
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHDiv.cpp"
                           ,0x104);
              }
              iVar13 = *piVar11;
              iVar1 = local_6d4[uVar17];
              bVar22 = SBORROW4(iVar13,iVar1);
              iVar3 = iVar13 - iVar1;
              bVar21 = iVar13 == iVar1;
LAB_0101280c:
              if (!bVar21 && bVar22 == iVar3 < 0) {
                bVar4 = false;
              }
              uVar17 = uVar17 + 1;
            } while (uVar18 != uVar17);
            lVar20 = local_6b0;
            if (bVar4) goto LAB_0101282f;
          }
          lVar14 = lVar14 + 1;
        } while ((int)lVar14 != iVar9);
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 < local_690);
  }
  iVar19 = (int)(data->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fNElements;
  if (iVar8 == iVar19) {
    if (local_638.super_TPZVec<int>.fStore == local_638.fExtAlloc) {
      local_638.super_TPZVec<int>.fStore = (int *)0x0;
    }
    local_638.super_TPZVec<int>.fNAlloc = 0;
    local_638.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
    if (local_638.super_TPZVec<int>.fStore != (int *)0x0) {
      operator_delete__(local_638.super_TPZVec<int>.fStore);
    }
    TPZGenMatrix<int>::~TPZGenMatrix((TPZGenMatrix<int> *)&local_680);
    if (local_198.fStore == local_178) {
      local_198.fStore = (int *)0x0;
    }
    local_198.fNAlloc = 0;
    local_198._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
    if (local_198.fStore != (int *)0x0) {
      operator_delete__(local_198.fStore);
    }
    TPZManVector<int,_10>::~TPZManVector(&local_1e0);
    if (local_390.fStore == local_370) {
      local_390.fStore = (int *)0x0;
    }
    local_390.fNAlloc = 0;
    local_390._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
    if (local_390.fStore != (int *)0x0) {
      operator_delete__(local_390.fStore);
    }
    if (local_2b8.fStore == local_298) {
      local_2b8.fStore = (int *)0x0;
    }
    local_2b8.fNAlloc = 0;
    local_2b8._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
    if (local_2b8.fStore != (int *)0x0) {
      operator_delete__(local_2b8.fStore);
    }
    if (local_468.fStore == local_448) {
      local_468.fStore = (int *)0x0;
    }
    local_468.fNAlloc = 0;
    local_468._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
    if (local_468.fStore != (int *)0x0) {
      operator_delete__(local_468.fStore);
    }
    if (local_540.fStore == local_520) {
      local_540.fStore = (int *)0x0;
    }
    local_540.fNAlloc = 0;
    local_540._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
    if (local_540.fStore != (int *)0x0) {
      operator_delete__(local_540.fStore);
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"count ",6);
  this = (ostream *)std::ostream::operator<<(&std::cout,iVar8);
  std::__ostream_insert<char,std::char_traits<char>>(this,"\nivs ",5);
  plVar12 = (long *)std::ostream::operator<<(this,iVar19);
  std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
  std::ostream::put((char)plVar12);
  std::ostream::flush();
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHDiv.cpp"
             ,0x113);
}

Assistant:

void TPZShapeHDiv<TSHAPE>::ComputeVecandShape(TPZShapeData &data) {
    const int64_t numvec = TSHAPE::Dimension*TSHAPE::NSides;
    TPZManVector<int,numvec> VectorSides(numvec),bilinear(numvec),directions(numvec);
    TPZManVector<int,numvec> normalsides(numvec);

    TSHAPE::GetSideHDivDirections(VectorSides,directions,bilinear,normalsides);

    if (data.fSDVecShapeIndex.size() == 0) {
        DebugStop();
    }
    
    // const int pressureorder = data.fHDivConnectOrders[TSHAPE::NFacets];//TODOPHIL
    const int pressureorder = data.fHDivConnectOrders[TSHAPE::NFacets];

    int nshape = TSHAPE::NShapeF(data.fH1ConnectOrders);

    int nexternalvectors = 0;
    TPZManVector<int> facevector(VectorSides.size(),TSHAPE::NSides-1);
    // compute the permutation which needs to be applied to the vectors to enforce compatibility between neighbours
    TPZManVector<int,81> vecpermute(TSHAPE::NSides*TSHAPE::Dimension);
    if (TSHAPE::Type() == EPiramide) {
        DebugStop();
    }
    int count = 0;
    for (int side = 0; side < TSHAPE::NSides; side++) {
        if (TSHAPE::SideDimension(side) != TSHAPE::Dimension -1) {
            continue;
        }
        TPZStack<int> smallsides;
        TSHAPE::LowerDimensionSides(side,smallsides);
//        TPZGeoElSide gelside(gel,side);
//        int nlowdim = gelside.NSides();
        const int nlowdim = smallsides.NElements()+1;
        TPZManVector<int,27> permgather(nlowdim);
        HDivPermutation(side,data, permgather);
        int counthold = count;
        for (int i=0; i<nlowdim; i++) {
            vecpermute[counthold+i] = permgather[i]+counthold;
            facevector[count] = side;
            count++;
        }
    }

    nexternalvectors = count;
    for (; count < vecpermute.size(); count++) {
        vecpermute[count] = count;
    }
    TPZGenMatrix<int> shapeorders(nshape,3);
    TSHAPE::ShapeOrder(data.fCornerNodeIds, data.fH1ConnectOrders, shapeorders);

//    int nshapeflux = NFluxShapeF();
//    IndexVecShape.Resize(nshapeflux);

    int scalarorder = data.fHDivConnectOrders[TSHAPE::NFacets]+1;
    // VectorSide indicates the side associated with each vector entry
    TPZManVector<int64_t,27> FirstIndex(TSHAPE::NSides+1);
    // the first index of the shape functions
    FirstShapeIndex(FirstIndex,scalarorder);

    int64_t nvec = VectorSides.NElements();
    count = 0;

    const int firstface = TSHAPE::NSides-TSHAPE::NFacets-1;
    for (int locvec = 0; locvec<nexternalvectors; locvec++) {
        int ivec = vecpermute[locvec];
        int side = VectorSides[ivec];
        int face = facevector[locvec];
//        int connectindex = SideConnectLocId(0, face);
        int connectindex = face-firstface;
//        int order = this->Connect(connectindex).Order();
        //int order = data.fHDivConnectOrders[connectindex];
        int order = data.fHDivConnectOrders[connectindex];//TODOPHIL

        int firstshape = FirstIndex[side];
        int lastshape = FirstIndex[side+1];

        for (int ish = firstshape; ish<lastshape; ish++) {
            int sidedimension = TSHAPE::SideDimension(side);
            int include=true;
            for (int d=0; d<sidedimension; d++)
            {
                if (shapeorders(ish,d) > order) {
                    include = false;
                }
            }
            if (include)
            {
                data.fSDVecShapeIndex[count] = std::make_pair(ivec, ish);
                count++;
            }
        }
    }


    for (int locvec = nexternalvectors; locvec<nvec; locvec++) {
        int ivec = vecpermute[locvec];
        int side = VectorSides[ivec];
        int bil = bilinear[ivec];
        int dir = directions[ivec];
        MElementType tipo = TSHAPE::Type(side);

        int firstshape = FirstIndex[side];
        int lastshape = FirstIndex[side+1];

        for (int ish = firstshape; ish<lastshape; ish++) {
            int sidedimension = TSHAPE::SideDimension(side);
            int maxorder[3] = {pressureorder,pressureorder,pressureorder};
            if (bil) {
                maxorder[dir]++;
            }
            int shord[3] = {0};
            int include=true;
            for (int d=0; d<sidedimension; d++)
            {
                if (tipo==ETriangle||tipo==ETetraedro)//
                {
                    shord[d] = shapeorders(ish,d);
                    int maxd = maxorder[d]+1;
                    if (shord[d] > maxd) {
                        include = false;
                    }
                }
                else if(tipo==EQuadrilateral)
                {
                    shord[d] = shapeorders(ish,d);
                    int maxd = maxorder[d];
                    if (shord[d] > maxd) {
                        include = false;
                    }
                }
                else if(tipo==ECube)
                {
                    shord[d] = shapeorders(ish,d);
                    if (shord[d] > maxorder[d]) {
                        include = false;
                    }
                }
                else if (tipo==EPrisma)
                {
                    //DebugStop();
                    if (shapeorders(ish,d) > maxorder[d]) {
                        include = false;
                    }
                }
                else if (tipo == EOned)
                {
                    shord[0] = shapeorders(ish,0);
                    if (shord[0] > maxorder[d]) {
                        include = false;
                    }
                }
                else if (tipo == EPiramide)
                {
                    shord[d] = shapeorders(ish,d);
                    if (shord[d] > maxorder[d]) {
                        include = false;
                    }
                }
                else
                {
                    DebugStop();
                }
            }
            if (include)
            {
                data.fSDVecShapeIndex[count] = std::make_pair(ivec, ish);
                count++;
            }
        }
    }

    int ivs =  data.fSDVecShapeIndex.size();
    if (count != ivs) {
        std::cout<<"count "<<count
                 <<"\nivs "<<ivs<<std::endl;
        DebugStop();
    }
    
}